

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall
kj::UnixEventPort::ChildExitPromiseAdapter::ChildExitPromiseAdapter
          (ChildExitPromiseAdapter *this,PromiseFulfiller<int> *fulfiller,ChildSet *childSet,
          Maybe<int> *pidRef)

{
  Maybe<int> *this_00;
  bool bVar1;
  int **ppiVar2;
  pair<int,_kj::UnixEventPort::ChildExitPromiseAdapter_*> pVar3;
  __enable_if_t<is_constructible<value_type,_pair<int,_ChildExitPromiseAdapter_*>_>::value,_pair<iterator,_bool>_>
  _Var4;
  Fault local_98;
  Fault f;
  ChildExitPromiseAdapter *local_80;
  pair<int,_kj::UnixEventPort::ChildExitPromiseAdapter_*> local_78;
  _Base_ptr local_68;
  bool local_60 [15];
  DebugExpression<bool> local_51;
  int *piStack_50;
  DebugExpression<bool> _kjCondition;
  Fault local_38;
  int *local_30;
  int *_kj_result;
  Maybe<int> *pidRef_local;
  ChildSet *childSet_local;
  PromiseFulfiller<int> *fulfiller_local;
  ChildExitPromiseAdapter *this_local;
  
  this->childSet = childSet;
  _kj_result = (int *)pidRef;
  pidRef_local = (Maybe<int> *)childSet;
  childSet_local = (ChildSet *)fulfiller;
  fulfiller_local = (PromiseFulfiller<int> *)this;
  local_30 = kj::_::readMaybe<int>(pidRef);
  if (local_30 == (int *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xfb,FAILED,"pidRef != nullptr",
               "\"`pid` must be non-null at the time `onChildExit()` is called\"",
               (char (*) [61])"`pid` must be non-null at the time `onChildExit()` is called");
    kj::_::Debug::Fault::fatal(&local_38);
  }
  ppiVar2 = mv<int*>(&local_30);
  this_00 = pidRef_local;
  piStack_50 = *ppiVar2;
  this->pid = *piStack_50;
  this->pidRef = (Maybe<int> *)_kj_result;
  this->fulfiller = (PromiseFulfiller<int> *)childSet_local;
  local_80 = this;
  pVar3 = std::make_pair<int&,kj::UnixEventPort::ChildExitPromiseAdapter*>(&this->pid,&local_80);
  local_78.second = pVar3.second;
  local_78.first = pVar3.first;
  _Var4 = std::
          map<int,kj::UnixEventPort::ChildExitPromiseAdapter*,std::less<int>,std::allocator<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>>
          ::insert<std::pair<int,kj::UnixEventPort::ChildExitPromiseAdapter*>>
                    ((map<int,kj::UnixEventPort::ChildExitPromiseAdapter*,std::less<int>,std::allocator<std::pair<int_const,kj::UnixEventPort::ChildExitPromiseAdapter*>>>
                      *)this_00,&local_78);
  f.exception = (Exception *)_Var4.first._M_node;
  local_60[0] = _Var4.second;
  local_68 = (_Base_ptr)f.exception;
  local_51 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_60);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_51);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[42]>
              (&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xfe,FAILED,"childSet.waiters.insert(std::make_pair(pid, this)).second",
               "_kjCondition,\"already called onChildExit() for this pid\"",&local_51,
               (char (*) [42])"already called onChildExit() for this pid");
    kj::_::Debug::Fault::fatal(&local_98);
  }
  return;
}

Assistant:

inline ChildExitPromiseAdapter(PromiseFulfiller<int>& fulfiller,
                                 ChildSet& childSet, Maybe<pid_t>& pidRef)
      : childSet(childSet),
        pid(KJ_REQUIRE_NONNULL(pidRef,
            "`pid` must be non-null at the time `onChildExit()` is called")),
        pidRef(pidRef), fulfiller(fulfiller) {
    KJ_REQUIRE(childSet.waiters.insert(std::make_pair(pid, this)).second,
        "already called onChildExit() for this pid");
  }